

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::PositionColorShader::shadeFragments
          (PositionColorShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  ulong uVar3;
  FragmentPacket *packet;
  int fragNdx;
  int fragNdx_00;
  int iVar4;
  deUint32 local_50;
  deUint32 local_4c;
  deUint32 local_48;
  deUint32 local_44;
  ulong local_40;
  FragmentPacket *local_38;
  
  if (0 < numPackets) {
    local_40 = (ulong)(uint)numPackets;
    iVar4 = 0;
    uVar3 = 0;
    local_38 = packets;
    do {
      packet = local_38 + uVar3;
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_50,packet,context,0,fragNdx_00);
        pGVar1 = context->outputArray;
        iVar2 = (iVar4 + fragNdx_00) * context->numFragmentOutputs;
        pGVar1[iVar2].v.uData[0] = local_50;
        pGVar1[iVar2].v.uData[1] = local_4c;
        pGVar1[iVar2].v.uData[2] = local_48;
        pGVar1[iVar2].v.uData[3] = local_44;
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 4;
    } while (uVar3 != local_40);
  }
  return;
}

Assistant:

void PositionColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readTriangleVarying<float>(packet, context, VARYINGLOC_COLOR, fragNdx));
	}
}